

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mplayer.c
# Opt level: O1

monst * mk_mplayer(permonst *ptr,level *lev,xchar x,xchar y,boolean special)

{
  xchar xVar1;
  xchar xVar2;
  short sVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  monst *pmVar9;
  size_t sVar10;
  obj *poVar11;
  short sVar12;
  int iVar13;
  int tmp;
  monst *pmVar14;
  char *pcVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  char nam [32];
  short local_98;
  short local_94;
  short local_90;
  short local_8c;
  short local_84;
  int local_58;
  short local_54 [18];
  
  if (mons + 0x168 < ptr || ptr < mons + 0x159) {
    return (monst *)0x0;
  }
  pmVar9 = lev->monsters[x][y];
  if ((pmVar9 != (monst *)0x0) && ((pmVar9->field_0x61 & 2) == 0)) {
    rloc(lev,pmVar9,'\0');
  }
  xVar2 = dungeon_topology.d_astral_level.dnum;
  xVar1 = u.uz.dnum;
  pmVar9 = makemon(ptr,lev,(int)x,(int)y,0);
  if (pmVar9 == (monst *)0x0) {
    return (monst *)0x0;
  }
  uVar5 = mt_random();
  local_98 = 0x26;
  if ((uVar5 & 1) == 0) {
    iVar6 = rnd_class(10,0x41);
    local_98 = (short)iVar6;
  }
  iVar6 = rnd_class(0x54,0x5d);
  local_94 = (short)iVar6;
  uVar5 = mt_random();
  if ((uVar5 & 7) == 0) {
    local_90 = 0;
  }
  else {
    iVar6 = rnd_class(0x80,0x87);
    local_90 = (short)iVar6;
  }
  uVar5 = mt_random();
  if ((uVar5 & 7) == 0) {
    local_8c = 0;
  }
  else {
    iVar6 = rnd_class(0x48,0x53);
    local_8c = (short)iVar6;
  }
  uVar5 = mt_random();
  if ((uVar5 & 7) == 0) {
    local_84 = 0;
  }
  else {
    iVar6 = rnd_class(0x89,0x8e);
    local_84 = (short)iVar6;
  }
  bVar17 = xVar1 == xVar2;
  bVar18 = special != '\0';
  uVar5 = mt_random();
  iVar6 = (uVar5 & 0xf) + 1;
  if (bVar18 && bVar17) {
    iVar6 = (uVar5 & 0xf) + 0xf;
  }
  pmVar9->m_lev = (uchar)iVar6;
  iVar13 = iVar6;
  do {
    uVar5 = mt_random();
    iVar6 = iVar6 + uVar5 % 10;
    iVar13 = iVar13 + -1;
  } while (iVar13 != 0);
  if (bVar18 && bVar17) {
    uVar5 = mt_random();
    iVar6 = uVar5 / 0x1e + uVar5 / 0x1e + (uVar5 / 0x1e) * -0x20 + uVar5 + iVar6 + 0x1f;
    pmVar9->mhpmax = iVar6;
    pmVar9->mhp = iVar6;
    uVar5 = pmVar9->data->mflags2;
    uVar8 = 0;
    do {
      uVar7 = mt_random();
      for (pmVar14 = level->monlist; bVar19 = pmVar14 == (monst *)0x0, !bVar19;
          pmVar14 = pmVar14->nmon) {
        if (pmVar14->data < (permonst *)((long)&mons[0x168].mname + 1) &&
            &mons[0x158].field_0x3f < pmVar14->data) {
          pcVar15 = developers[uVar7 % 0x35];
          sVar12 = pmVar14->mxlth;
          sVar10 = strlen(pcVar15);
          iVar6 = strncmp(pcVar15,(char *)((long)(pmVar14->mtrack + 0x18) + (long)sVar12),sVar10);
          if (iVar6 == 0) break;
        }
      }
    } while ((!bVar19) && (bVar16 = uVar8 < 99, uVar8 = uVar8 + 1, bVar16));
    if (bVar19) {
      pcVar15 = developers[uVar7 % 0x35];
    }
    else {
      pcVar15 = (char *)0x0;
    }
    if (pcVar15 == (char *)0x0) {
      pcVar15 = "Eve";
      if ((uVar5 >> 0x11 & 1) == 0) {
        pcVar15 = "Adam";
      }
    }
    else if (((uVar5 >> 0x11 & 1) != 0) && (iVar6 = strcmp(pcVar15,"Janet"), iVar6 != 0)) {
      uVar8 = mt_random();
      pcVar15 = "Maud";
      if ((uVar8 & 1) == 0) {
        pcVar15 = "Eve";
      }
    }
    strcpy((char *)&local_58,pcVar15);
    if (((uVar5 >> 0x11 & 1) == 0) && (local_54[0] != 0x74 || local_58 != 0x656e614a)) {
      pmVar9->field_0x60 = pmVar9->field_0x60 & 0xfe;
    }
    else {
      pmVar9->field_0x60 = pmVar9->field_0x60 | 1;
    }
    sVar10 = strlen((char *)&local_58);
    *(undefined4 *)((long)local_54 + (sVar10 - 4)) = 0x65687420;
    *(undefined2 *)((long)local_54 + sVar10) = 0x20;
    bVar4 = pmVar9->m_lev;
    iVar6 = monsndx(pmVar9->data);
    pcVar15 = rank_of((uint)bVar4,(short)iVar6,(byte)*(undefined4 *)&pmVar9->field_0x60 & 1);
    strcat((char *)&local_58,pcVar15);
    pmVar9 = christen_monst(pmVar9,(char *)&local_58);
    mongets(pmVar9,0xd8);
  }
  else {
    pmVar9->mhpmax = iVar6 + 0x1e;
    pmVar9->mhp = iVar6 + 0x1e;
  }
  pmVar9->field_0x62 = pmVar9->field_0x62 & 0xbf;
  set_malign(pmVar9);
  iVar6 = monsndx(ptr);
  switch(iVar6) {
  case 0x159:
    uVar5 = mt_random();
    bVar19 = (uVar5 & 1) == 0;
    sVar12 = 0x41;
    goto LAB_001f225d;
  case 0x15a:
    uVar5 = mt_random();
    if ((uVar5 & 1) != 0) {
      uVar5 = mt_random();
      local_98 = 0x27;
      if ((uVar5 & 1) == 0) {
        local_98 = 0x1c;
      }
      local_84 = 0;
    }
    uVar5 = mt_random();
    if ((uVar5 & 1) != 0) {
      iVar6 = rnd_class(0x6a,0x71);
      local_94 = (short)iVar6;
    }
    if (local_8c == 0x51) {
      local_8c = 0;
    }
    goto switchD_001f2000_caseD_15d;
  case 0x15b:
  case 0x15c:
    uVar5 = mt_random();
    sVar12 = 0x39;
    if ((uVar5 & 3) == 0) {
      uVar5 = mt_random();
      sVar12 = 0x3c;
      if ((uVar5 & 1) == 0) {
        sVar12 = local_98;
      }
    }
    if (local_8c == 0x51) {
      local_8c = 0;
    }
    break;
  case 0x15d:
  case 0x166:
    goto switchD_001f2000_caseD_15d;
  case 0x15e:
    uVar5 = mt_random();
    sVar12 = 0x3e;
    if (((uVar5 & 3) == 0) && (uVar5 = mt_random(), sVar12 = local_98, (uVar5 & 1) != 0)) {
      uVar5 = mt_random();
      sVar12 = 0x10a;
      if ((uVar5 & 1) == 0) {
        sVar12 = 0x16;
      }
    }
    uVar5 = mt_random();
    if ((uVar5 & 3) != 0) {
      uVar5 = mt_random();
      local_8c = (ushort)((uVar5 & 1) == 0) * 2 + 0x51;
    }
    uVar5 = mt_random();
    if ((uVar5 & 1) != 0) {
      local_84 = 0;
    }
    break;
  case 0x15f:
    uVar5 = mt_random();
    uVar5 = uVar5 & 3;
    sVar12 = 0x26;
    goto LAB_001f2158;
  case 0x160:
    uVar5 = mt_random();
    if ((uVar5 & 1) != 0) {
      local_84 = 0;
    }
    local_90 = 0x81;
    local_94 = 0;
    sVar12 = 0;
    break;
  case 0x161:
  case 0x162:
    uVar5 = mt_random();
    sVar12 = 0x39;
    if ((uVar5 & 1) == 0) {
      sVar12 = local_98;
    }
    uVar5 = mt_random();
    if ((uVar5 & 1) != 0) {
      iVar6 = rnd_class(0x6a,0x71);
      local_94 = (short)iVar6;
    }
    uVar5 = mt_random();
    sVar3 = 0x81;
    if ((uVar5 & 3) == 0) {
      sVar3 = local_90;
    }
    local_90 = sVar3;
    uVar5 = mt_random();
    if ((uVar5 & 3) != 0) {
      uVar5 = mt_random();
      local_8c = (ushort)((uVar5 & 1) == 0) * 2 + 0x51;
    }
    uVar5 = mt_random();
    if ((uVar5 & 1) != 0) {
      local_84 = 0;
    }
    break;
  case 0x163:
    uVar5 = mt_random();
    bVar19 = (uVar5 & 1) == 0;
    sVar12 = 0x12;
    goto LAB_001f225d;
  case 0x164:
    uVar5 = mt_random();
    bVar19 = (uVar5 & 1) == 0;
    sVar12 = 0x1d;
    goto LAB_001f225d;
  case 0x165:
    uVar5 = mt_random();
    bVar19 = (uVar5 & 1) == 0;
    sVar12 = 0x28;
LAB_001f225d:
    if (bVar19) {
      sVar12 = local_98;
    }
    break;
  case 0x167:
    uVar5 = mt_random();
    uVar5 = uVar5 & 1;
    sVar12 = 0x3b;
LAB_001f2158:
    if (uVar5 == 0) {
      sVar12 = local_98;
    }
    uVar5 = mt_random();
    if ((uVar5 & 1) != 0) {
      iVar6 = rnd_class(0x6a,0x71);
      local_94 = (short)iVar6;
    }
    break;
  case 0x168:
    uVar5 = mt_random();
    if ((uVar5 & 3) != 0) {
      uVar5 = mt_random();
      local_98 = 0x3e;
      if ((uVar5 & 1) == 0) {
        local_98 = 0x15;
      }
    }
    uVar5 = mt_random();
    if ((uVar5 & 1) != 0) {
      uVar5 = mt_random();
      local_94 = ((ushort)uVar5 & 1) * 4 + 0x55;
      local_90 = 0x86;
    }
    uVar5 = mt_random();
    sVar12 = 0x51;
    if ((uVar5 & 3) == 0) {
      sVar12 = local_8c;
    }
    local_8c = sVar12;
    local_84 = 0;
    goto switchD_001f2000_caseD_15d;
  default:
    monsndx(ptr);
    warning("bad mplayer monster: %d");
    sVar12 = 0;
  }
LAB_001f2264:
  if (sVar12 == 0) goto LAB_001f2335;
  poVar11 = mksobj(lev,(int)sVar12,'\x01','\0');
  uVar5 = mt_random();
  if (bVar18 && bVar17) {
    bVar4 = (byte)uVar5 + (char)(uVar5 / 5) * -5 + 4;
  }
  else {
    bVar4 = (byte)uVar5 & 3;
  }
  poVar11->spe = bVar4;
  uVar5 = mt_random();
  if (uVar5 * -0x55555555 < 0x55555556) {
    uVar5 = 0x1000;
LAB_001f22d9:
    *(uint *)&poVar11->field_0x4a = *(uint *)&poVar11->field_0x4a | uVar5;
  }
  else {
    uVar8 = mt_random();
    uVar5 = 0x100000;
    if ((uVar8 & 1) == 0) goto LAB_001f22d9;
  }
  if (bVar18 && bVar17) {
    uVar5 = mt_random();
    if (uVar5 * -0x33333333 < 0x33333334) {
      poVar11 = mk_artifact(lev,poVar11,-0x80);
    }
    else {
      poVar11 = create_oprop(lev,poVar11,'\0');
    }
  }
  if (poVar11->oartifact == '\n') {
    uVar5 = mt_random();
    poVar11->spe = ((byte)uVar5 & 3) + 1;
  }
  mpickobj(pmVar9,poVar11);
LAB_001f2335:
  if (bVar18 && bVar17) {
    uVar5 = mt_random();
    if ((uVar5 * -0x33333333 >> 1 | (uint)((uVar5 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a) {
      uVar5 = mt_random();
      mongets(pmVar9,(uVar5 * -0x55555555 < 0x55555556) + 0x20f);
    }
    mk_mplayer_armor(pmVar9,local_94);
    mk_mplayer_armor(pmVar9,local_90);
    mk_mplayer_armor(pmVar9,local_8c);
    mk_mplayer_armor(pmVar9,local_84);
    uVar5 = mt_random();
    if ((uVar5 & 7) != 0) {
      iVar6 = rnd_class(0x8f,0x92);
      mk_mplayer_armor(pmVar9,(short)iVar6);
    }
    uVar5 = mt_random();
    if ((uVar5 & 7) != 0) {
      iVar6 = rnd_class(0x93,0x9c);
      mk_mplayer_armor(pmVar9,(short)iVar6);
    }
    m_dowear(lev,pmVar9,'\x01');
    uVar8 = mt_random();
    uVar5 = mt_random();
    if (uVar8 * -0x55555555 < 0x55555556) {
      uVar5 = uVar5 & 0xf;
    }
    else {
      uVar5 = uVar5 % 3;
    }
    for (; uVar5 != 0; uVar5 = uVar5 - 1) {
      iVar6 = rnd_class(0x1f0,0x205);
      mongets(pmVar9,iVar6);
    }
    uVar5 = mt_random();
    mkmonmoney(pmVar9,(ulong)(uVar5 % 1000));
    uVar5 = mt_random();
    for (uVar5 = uVar5 % 10; uVar5 != 0; uVar5 = uVar5 - 1) {
      poVar11 = mkobj(lev,'\0','\0');
      mpickobj(pmVar9,poVar11);
    }
  }
  uVar5 = mt_random();
  iVar6 = uVar5 % 3 + 1;
  do {
    iVar13 = rnd_offensive_item(pmVar9);
    mongets(pmVar9,iVar13);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  uVar5 = mt_random();
  iVar6 = uVar5 % 3 + 1;
  do {
    iVar13 = rnd_defensive_item(pmVar9);
    mongets(pmVar9,iVar13);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  uVar5 = mt_random();
  iVar6 = uVar5 % 3 + 1;
  do {
    iVar13 = rnd_misc_item(pmVar9);
    mongets(pmVar9,iVar13);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  return pmVar9;
switchD_001f2000_caseD_15d:
  sVar12 = local_98;
  goto LAB_001f2264;
}

Assistant:

struct monst *mk_mplayer(const struct permonst *ptr,
			 struct level *lev, xchar x, xchar y, boolean special)
{
	struct monst *mtmp;
	char nam[PL_NSIZ];

	if (!is_mplayer(ptr))
		return NULL;

	if (MON_AT(lev, x, y))
		rloc(lev, m_at(lev, x, y), FALSE); /* insurance */

	if (!In_endgame(&u.uz)) special = FALSE;

	if ((mtmp = makemon(ptr, lev, x, y, NO_MM_FLAGS)) != 0) {
	    short weapon = rn2(2) ? LONG_SWORD : rnd_class(SPEAR, BULLWHIP);
	    short armor = rnd_class(GRAY_DRAGON_SCALE_MAIL, YELLOW_DRAGON_SCALE_MAIL);
	    short cloak = !rn2(8) ? STRANGE_OBJECT :
	    		rnd_class(OILSKIN_CLOAK, CLOAK_OF_DISPLACEMENT);
	    short helm = !rn2(8) ? STRANGE_OBJECT :
	    		rnd_class(ELVEN_LEATHER_HELM, HELM_OF_TELEPATHY);
	    short shield = !rn2(8) ? STRANGE_OBJECT :
	    		rnd_class(ELVEN_SHIELD, SHIELD_OF_REFLECTION);
	    int quan;
	    struct obj *otmp;

	    mtmp->m_lev = (special ? rn1(16,15) : rnd(16));
	    mtmp->mhp = mtmp->mhpmax = dice((int)mtmp->m_lev,10) +
					(special ? (30 + rnd(30)) : 30);
	    if (special) {
	        get_mplname(mtmp, nam);
	        mtmp = christen_monst(mtmp, nam);
		/* that's why they are "stuck" in the endgame :-) */
		mongets(mtmp, FAKE_AMULET_OF_YENDOR);
	    }
	    mtmp->mpeaceful = 0;
	    set_malign(mtmp); /* peaceful may have changed again */

	    switch (monsndx(ptr)) {
		case PM_ARCHEOLOGIST:
		    if (rn2(2)) weapon = BULLWHIP;
		    break;
		case PM_BARBARIAN:
		    if (rn2(2)) {
		    	weapon = rn2(2) ? TWO_HANDED_SWORD : BATTLE_AXE;
		    	shield = STRANGE_OBJECT;
		    }
		    if (rn2(2)) armor = rnd_class(PLATE_MAIL, CHAIN_MAIL);
		    if (helm == HELM_OF_BRILLIANCE) helm = STRANGE_OBJECT;
		    break;
		case PM_CAVEMAN:
		case PM_CAVEWOMAN:
		    if (rn2(4)) weapon = MACE;
		    else if (rn2(2)) weapon = CLUB;
		    if (helm == HELM_OF_BRILLIANCE) helm = STRANGE_OBJECT;
		    break;
		case PM_CONVICT:
		    /* Defaults are just fine. */
		    break;
		case PM_HEALER:
		    if (rn2(4)) weapon = QUARTERSTAFF;
		    else if (rn2(2)) weapon = rn2(2) ? UNICORN_HORN : SCALPEL;
		    if (rn2(4)) helm = rn2(2) ? HELM_OF_BRILLIANCE : HELM_OF_TELEPATHY;
		    if (rn2(2)) shield = STRANGE_OBJECT;
		    break;
		case PM_KNIGHT:
		    if (rn2(4)) weapon = LONG_SWORD;
		    if (rn2(2)) armor = rnd_class(PLATE_MAIL, CHAIN_MAIL);
		    break;
		case PM_MONK:
		    weapon = STRANGE_OBJECT;
		    armor = STRANGE_OBJECT;
		    cloak = ROBE;
		    if (rn2(2)) shield = STRANGE_OBJECT;
		    break;
		case PM_PRIEST:
		case PM_PRIESTESS:
		    if (rn2(2)) weapon = MACE;
		    if (rn2(2)) armor = rnd_class(PLATE_MAIL, CHAIN_MAIL);
		    if (rn2(4)) cloak = ROBE;
		    if (rn2(4)) helm = rn2(2) ? HELM_OF_BRILLIANCE : HELM_OF_TELEPATHY;
		    if (rn2(2)) shield = STRANGE_OBJECT;
		    break;
		case PM_RANGER:
		    if (rn2(2)) weapon = ELVEN_DAGGER;
		    break;
		case PM_ROGUE:
		    if (rn2(2)) weapon = SHORT_SWORD;
		    break;
		case PM_SAMURAI:
		    if (rn2(2)) weapon = KATANA;
		    break;
		case PM_TOURIST:
		    /* Defaults are just fine */
		    break;
		case PM_VALKYRIE:
		    if (rn2(2)) weapon = WAR_HAMMER;
		    if (rn2(2)) armor = rnd_class(PLATE_MAIL, CHAIN_MAIL);
		    break;
		case PM_WIZARD:
		    if (rn2(4)) weapon = rn2(2) ? QUARTERSTAFF : ATHAME;
		    if (rn2(2)) {
		    	armor = rn2(2) ? BLACK_DRAGON_SCALE_MAIL :
		    			SILVER_DRAGON_SCALE_MAIL;
		    	cloak = CLOAK_OF_MAGIC_RESISTANCE;
		    }
		    if (rn2(4)) helm = HELM_OF_BRILLIANCE;
		    shield = STRANGE_OBJECT;
		    break;
		default:
		    warning("bad mplayer monster: %d", monsndx(ptr));
		    weapon = 0;
		    break;
	    }

	    if (weapon != STRANGE_OBJECT) {
		otmp = mksobj(lev, weapon, TRUE, FALSE);
		otmp->spe = (special ? rn1(5,4) : rn2(4));
		if (!rn2(3)) otmp->oerodeproof = 1;
		else if (!rn2(2)) otmp->greased = 1;
		if (special) {
		    if (!rn2(5))
			otmp = mk_artifact(lev, otmp, A_NONE);
		    else
			otmp = create_oprop(lev, otmp, FALSE);
		}
		/* mplayers knew better than to overenchant Magicbane */
		if (otmp->oartifact == ART_MAGICBANE)
		    otmp->spe = rnd(4);
		mpickobj(mtmp, otmp);
	    }

	    if (special) {
		if (!rn2(10))
		    mongets(mtmp, rn2(3) ? LUCKSTONE : LOADSTONE);
		mk_mplayer_armor(mtmp, armor);
		mk_mplayer_armor(mtmp, cloak);
		mk_mplayer_armor(mtmp, helm);
		mk_mplayer_armor(mtmp, shield);
		if (rn2(8))
		    mk_mplayer_armor(mtmp, rnd_class(LEATHER_GLOVES,
					       GAUNTLETS_OF_DEXTERITY));
		if (rn2(8))
		    mk_mplayer_armor(mtmp, rnd_class(LOW_BOOTS, LEVITATION_BOOTS));
		m_dowear(lev, mtmp, TRUE);

		quan = rn2(3) ? rn2(3) : rn2(16);
		while (quan--)
		    mongets(mtmp, rnd_class(DILITHIUM_CRYSTAL, JADE));
		/* To get the gold "right" would mean a player can double his */
		/* gold supply by killing one mplayer.  Not good. */
		mkmonmoney(mtmp, rn2(1000));
		quan = rn2(10);
		while (quan--)
		    mpickobj(mtmp, mkobj(lev, RANDOM_CLASS, FALSE));
	    }
	    quan = rnd(3);
	    while (quan--)
		mongets(mtmp, rnd_offensive_item(mtmp));
	    quan = rnd(3);
	    while (quan--)
		mongets(mtmp, rnd_defensive_item(mtmp));
	    quan = rnd(3);
	    while (quan--)
		mongets(mtmp, rnd_misc_item(mtmp));
	}

	return mtmp;
}